

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O3

char * trimWhitespace(char *str)

{
  char *pcVar1;
  ushort **ppuVar2;
  size_t sVar3;
  ulong uVar4;
  char *__s;
  
  ppuVar2 = __ctype_b_loc();
  pcVar1 = gTempBuf;
  do {
    __s = pcVar1;
    pcVar1 = __s + 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)*__s * 2 + 1) & 0x20) != 0);
  if (*__s != '\0') {
    sVar3 = strlen(__s);
    if (0 < (int)(uint)sVar3) {
      uVar4 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
      do {
        if ((*(byte *)((long)*ppuVar2 + (long)__s[uVar4 - 2] * 2 + 1) & 0x20) == 0) {
          return __s;
        }
        __s[uVar4 - 2] = '\0';
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  return __s;
}

Assistant:

static char *trimWhitespace( char *str )
{
   int i;

   if( !str ) return str;

   while( isspace(*str) ) str++;
   if( *str == '\0' ) return str;

   for( i=(int)strlen(str)-1; i >= 0; i-- )
   {
      if( !isspace(str[i]) )
         return str;
      str[i] = '\0';
   }

   return str;
}